

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPolarDecomposition.cpp
# Opt level: O0

uint __thiscall
btPolarDecomposition::decompose
          (btPolarDecomposition *this,btMatrix3x3 *a,btMatrix3x3 *u,btMatrix3x3 *h)

{
  bool bVar1;
  btMatrix3x3 *in_RCX;
  btMatrix3x3 *in_RDX;
  btMatrix3x3 *in_RSI;
  float *in_RDI;
  btScalar bVar2;
  btMatrix3x3 delta;
  btScalar inv_gamma;
  btScalar gamma;
  btScalar u_norm;
  btScalar h_norm;
  btScalar u_inf;
  btScalar u_1;
  btScalar h_inf;
  btScalar h_1;
  uint i;
  btMatrix3x3 *in_stack_fffffffffffffc60;
  btScalar *in_stack_fffffffffffffca8;
  btMatrix3x3 *in_stack_fffffffffffffcb0;
  btMatrix3x3 *in_stack_fffffffffffffcc0;
  btMatrix3x3 *in_stack_fffffffffffffcd0;
  btMatrix3x3 *in_stack_fffffffffffffcd8;
  btMatrix3x3 *in_stack_fffffffffffffce0;
  btMatrix3x3 *in_stack_fffffffffffffcf8;
  btMatrix3x3 *in_stack_fffffffffffffd00;
  btMatrix3x3 local_2c8;
  undefined4 local_298;
  btMatrix3x3 local_234 [2];
  btMatrix3x3 local_1d4;
  btMatrix3x3 local_1a4;
  undefined4 local_174;
  float local_110;
  float local_7c;
  btScalar local_78;
  float local_74;
  float local_70;
  btScalar local_6c;
  float local_68;
  btScalar local_64;
  btScalar local_60;
  float local_5c;
  btMatrix3x3 local_58;
  btMatrix3x3 *local_28;
  
  local_28 = in_RCX;
  btMatrix3x3::operator=(in_RDX,in_RSI);
  btMatrix3x3::inverse(in_stack_fffffffffffffcd0);
  btMatrix3x3::operator=(local_28,&local_58);
  for (local_5c = 0.0; (uint)local_5c < (uint)in_RDI[1]; local_5c = (float)((int)local_5c + 1)) {
    local_60 = anon_unknown.dwarf_70123::p1_norm(in_stack_fffffffffffffc60);
    local_64 = anon_unknown.dwarf_70123::pinf_norm(in_stack_fffffffffffffc60);
    local_68 = anon_unknown.dwarf_70123::p1_norm(in_stack_fffffffffffffc60);
    local_6c = anon_unknown.dwarf_70123::pinf_norm(in_stack_fffffffffffffc60);
    local_70 = local_60 * local_64;
    local_74 = local_68 * local_6c;
    bVar1 = btFuzzyZero(0.0);
    if ((bVar1) || (bVar1 = btFuzzyZero(0.0), bVar1)) break;
    local_78 = btPow(0.0,1.958022e-39);
    local_7c = 1.0 / local_78;
    local_110 = local_78 - 2.0;
    ::operator*(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    btMatrix3x3::transpose(in_stack_fffffffffffffcc0);
    ::operator*(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    operator+(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    local_174 = 0x3f000000;
    ::operator*(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    btMatrix3x3::operator+=(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
    btMatrix3x3::inverse(in_stack_fffffffffffffcd0);
    btMatrix3x3::operator=(local_28,&local_1a4);
    bVar2 = anon_unknown.dwarf_70123::p1_norm(in_stack_fffffffffffffc60);
    if (bVar2 <= *in_RDI * local_68) {
      btMatrix3x3::transpose(in_stack_fffffffffffffcc0);
      ::operator*(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      btMatrix3x3::operator=(local_28,&local_1d4);
      btMatrix3x3::transpose(in_stack_fffffffffffffcc0);
      operator+(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
      local_298 = 0x3f000000;
      ::operator*(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      btMatrix3x3::operator=(local_28,local_234);
      return (uint)local_5c;
    }
  }
  btMatrix3x3::transpose(in_stack_fffffffffffffcc0);
  ::operator*(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  btMatrix3x3::operator=(local_28,&local_2c8);
  btMatrix3x3::transpose(in_stack_fffffffffffffcc0);
  operator+(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  ::operator*(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  btMatrix3x3::operator=(local_28,(btMatrix3x3 *)&stack0xfffffffffffffcd8);
  return (uint)in_RDI[1];
}

Assistant:

unsigned int btPolarDecomposition::decompose(const btMatrix3x3& a, btMatrix3x3& u, btMatrix3x3& h) const
{
  // Use the 'u' and 'h' matrices for intermediate calculations
  u = a;
  h = a.inverse();

  for (unsigned int i = 0; i < m_maxIterations; ++i)
  {
    const btScalar h_1 = p1_norm(h);
    const btScalar h_inf = pinf_norm(h);
    const btScalar u_1 = p1_norm(u);
    const btScalar u_inf = pinf_norm(u);

    const btScalar h_norm = h_1 * h_inf;
    const btScalar u_norm = u_1 * u_inf;

    // The matrix is effectively singular so we cannot invert it
    if (btFuzzyZero(h_norm) || btFuzzyZero(u_norm))
      break;

    const btScalar gamma = btPow(h_norm / u_norm, 0.25f);
    const btScalar inv_gamma = btScalar(1.0) / gamma;

    // Determine the delta to 'u'
    const btMatrix3x3 delta = (u * (gamma - btScalar(2.0)) + h.transpose() * inv_gamma) * btScalar(0.5);

    // Update the matrices
    u += delta;
    h = u.inverse();

    // Check for convergence
    if (p1_norm(delta) <= m_tolerance * u_1)
    {
      h = u.transpose() * a;
      h = (h + h.transpose()) * 0.5;
      return i;
    }
  }

  // The algorithm has failed to converge to the specified tolerance, but we
  // want to make sure that the matrices returned are in the right form.
  h = u.transpose() * a;
  h = (h + h.transpose()) * 0.5;

  return m_maxIterations;
}